

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  int iVar1;
  long in_RSI;
  long in_R8;
  int in_R9D;
  char *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if (in_R9D == 0) {
    iVar1 = LZ4_decompress_safe((char *)CONCAT44(dictSize,in_stack_00000008),unaff_retaddr,
                                in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
  }
  else if (in_R8 + in_R9D == in_RSI) {
    if (in_R9D < 0xffff) {
      iVar1 = LZ4_decompress_safe_withSmallPrefix
                        ((char *)CONCAT44(compressedSize,maxOutputSize),dictStart,dictSize,
                         in_stack_00000008,(size_t)unaff_retaddr);
    }
    else {
      iVar1 = LZ4_decompress_safe_withPrefix64k
                        ((char *)CONCAT44(dictSize,in_stack_00000008),unaff_retaddr,
                         in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    }
  }
  else {
    iVar1 = LZ4_decompress_safe_forceExtDict
                      ((char *)CONCAT44(compressedSize,maxOutputSize),dictStart,dictSize,
                       in_stack_00000008,unaff_retaddr,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}